

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermediate_code.cpp
# Opt level: O3

ExprNode * __thiscall InReg::accessCode(InReg *this)

{
  Temp *pTVar1;
  ExprNode *pEVar2;
  
  pEVar2 = (ExprNode *)operator_new(0x18);
  pTVar1 = this->temp;
  (pEVar2->super_StmNode).super_ICTNode._vptr_ICTNode = (_func_int **)&PTR__TEMP_00125440;
  pEVar2[1].super_StmNode.super_ICTNode._vptr_ICTNode = (_func_int **)pTVar1;
  (pEVar2->super_StmNode).typeStm = 3;
  return pEVar2;
}

Assistant:

ExprNode *InReg::accessCode() {
    return new TEMP(this->getTemp());
}